

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConnectorFederateManager.cpp
# Opt level: O0

Translator * __thiscall
helics::ConnectorFederateManager::getTranslator(ConnectorFederateManager *this,int index)

{
  bool bVar1;
  undefined4 in_ESI;
  handle sharedTran;
  StringMappedVector<helics::Translator,_(reference_stability)0,_5> *in_stack_ffffffffffffffa8;
  StringMappedVector<helics::Translator,_(reference_stability)0,_5> *this_00;
  int in_stack_ffffffffffffffe8;
  undefined1 *local_8;
  
  this_00 = (StringMappedVector<helics::Translator,_(reference_stability)0,_5> *)
            &stack0xffffffffffffffd0;
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>,_std::shared_mutex>
  ::lock((shared_guarded_opt<gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>,_std::shared_mutex>
          *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8));
  gmlc::libguarded::
  lock_handle<gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>,_std::shared_mutex>
  ::operator*((lock_handle<gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>,_std::shared_mutex>
               *)this_00);
  bVar1 = isValidIndex<int,gmlc::containers::StringMappedVector<helics::Translator,(reference_stability)0,5>>
                    ((int)((ulong)this_00 >> 0x20),in_stack_ffffffffffffffa8);
  if (bVar1) {
    gmlc::libguarded::
    lock_handle<gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>,_std::shared_mutex>
    ::operator*((lock_handle<gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>,_std::shared_mutex>
                 *)&stack0xffffffffffffffd0);
    local_8 = (undefined1 *)
              gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>::
              operator[](this_00,(size_t)in_stack_ffffffffffffffa8);
  }
  else {
    local_8 = invalidTranNC;
  }
  gmlc::libguarded::
  lock_handle<gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>,_std::shared_mutex>
  ::~lock_handle((lock_handle<gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>,_std::shared_mutex>
                  *)0x3e1d9e);
  return (Translator *)local_8;
}

Assistant:

Translator& ConnectorFederateManager::getTranslator(int index)
{
    auto sharedTran = translators.lock();
    if (isValidIndex(index, *sharedTran)) {
        return (*sharedTran)[index];
    }
    return invalidTranNC;
}